

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  ulong uVar38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  int iVar61;
  uint uVar62;
  uint uVar63;
  long lVar64;
  long lVar65;
  ulong uVar66;
  undefined1 (*pauVar67) [16];
  ulong uVar68;
  undefined1 (*pauVar69) [16];
  ulong uVar70;
  undefined1 (*pauVar71) [16];
  undefined1 (*pauVar72) [16];
  ulong uVar73;
  undefined4 uVar74;
  ulong unaff_R12;
  ulong uVar75;
  ulong uVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [64];
  undefined1 auVar83 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 extraout_var [56];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar96 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar108;
  float fVar113;
  undefined1 auVar109 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  float fVar121;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar124 [64];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [64];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [64];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  undefined1 auVar143 [32];
  undefined1 auVar144 [64];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined8 local_29d0;
  undefined8 uStack_29c8;
  undefined8 *local_29b8;
  ulong local_29b0;
  ulong local_29a8;
  ulong local_29a0;
  long local_2998;
  RTCFilterFunctionNArguments local_2990;
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  RTCHitN local_28b0 [16];
  undefined1 local_28a0 [16];
  undefined1 local_2890 [16];
  undefined1 local_2880 [16];
  undefined1 local_2870 [16];
  undefined1 local_2860 [16];
  undefined1 local_2850 [16];
  uint local_2840;
  uint uStack_283c;
  uint uStack_2838;
  uint uStack_2834;
  uint uStack_2830;
  uint uStack_282c;
  uint uStack_2828;
  uint uStack_2824;
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  float local_26e0 [4];
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  undefined4 uStack_26c4;
  float local_26c0 [4];
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined4 uStack_26a4;
  float local_26a0 [4];
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  undefined4 uStack_2684;
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [8];
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined4 uStack_2524;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar72 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar74 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_2560._4_4_ = uVar74;
  local_2560._0_4_ = uVar74;
  local_2560._8_4_ = uVar74;
  local_2560._12_4_ = uVar74;
  local_2560._16_4_ = uVar74;
  local_2560._20_4_ = uVar74;
  local_2560._24_4_ = uVar74;
  local_2560._28_4_ = uVar74;
  auVar119 = ZEXT3264(local_2560);
  uVar74 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2580._4_4_ = uVar74;
  local_2580._0_4_ = uVar74;
  local_2580._8_4_ = uVar74;
  local_2580._12_4_ = uVar74;
  local_2580._16_4_ = uVar74;
  local_2580._20_4_ = uVar74;
  local_2580._24_4_ = uVar74;
  local_2580._28_4_ = uVar74;
  auVar120 = ZEXT3264(local_2580);
  uVar74 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_25a0._4_4_ = uVar74;
  local_25a0._0_4_ = uVar74;
  local_25a0._8_4_ = uVar74;
  local_25a0._12_4_ = uVar74;
  local_25a0._16_4_ = uVar74;
  local_25a0._20_4_ = uVar74;
  local_25a0._24_4_ = uVar74;
  local_25a0._28_4_ = uVar74;
  auVar124 = ZEXT3264(local_25a0);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar31 = fVar1 * 0.99999964;
  local_25c0._4_4_ = fVar31;
  local_25c0._0_4_ = fVar31;
  local_25c0._8_4_ = fVar31;
  local_25c0._12_4_ = fVar31;
  local_25c0._16_4_ = fVar31;
  local_25c0._20_4_ = fVar31;
  local_25c0._24_4_ = fVar31;
  local_25c0._28_4_ = fVar31;
  auVar133 = ZEXT3264(local_25c0);
  fVar31 = fVar2 * 0.99999964;
  local_25e0._4_4_ = fVar31;
  local_25e0._0_4_ = fVar31;
  local_25e0._8_4_ = fVar31;
  local_25e0._12_4_ = fVar31;
  local_25e0._16_4_ = fVar31;
  local_25e0._20_4_ = fVar31;
  local_25e0._24_4_ = fVar31;
  local_25e0._28_4_ = fVar31;
  auVar136 = ZEXT3264(local_25e0);
  fVar31 = fVar3 * 0.99999964;
  local_2600._4_4_ = fVar31;
  local_2600._0_4_ = fVar31;
  local_2600._8_4_ = fVar31;
  local_2600._12_4_ = fVar31;
  local_2600._16_4_ = fVar31;
  local_2600._20_4_ = fVar31;
  local_2600._24_4_ = fVar31;
  local_2600._28_4_ = fVar31;
  auVar139 = ZEXT3264(local_2600);
  fVar1 = fVar1 * 1.0000004;
  local_2620._4_4_ = fVar1;
  local_2620._0_4_ = fVar1;
  local_2620._8_4_ = fVar1;
  local_2620._12_4_ = fVar1;
  local_2620._16_4_ = fVar1;
  local_2620._20_4_ = fVar1;
  local_2620._24_4_ = fVar1;
  local_2620._28_4_ = fVar1;
  auVar140 = ZEXT3264(local_2620);
  fVar2 = fVar2 * 1.0000004;
  local_2640._4_4_ = fVar2;
  local_2640._0_4_ = fVar2;
  local_2640._8_4_ = fVar2;
  local_2640._12_4_ = fVar2;
  local_2640._16_4_ = fVar2;
  local_2640._20_4_ = fVar2;
  local_2640._24_4_ = fVar2;
  local_2640._28_4_ = fVar2;
  auVar142 = ZEXT3264(local_2640);
  fVar3 = fVar3 * 1.0000004;
  local_2660._4_4_ = fVar3;
  local_2660._0_4_ = fVar3;
  local_2660._8_4_ = fVar3;
  local_2660._12_4_ = fVar3;
  local_2660._16_4_ = fVar3;
  local_2660._20_4_ = fVar3;
  local_2660._24_4_ = fVar3;
  local_2660._28_4_ = fVar3;
  auVar144 = ZEXT3264(local_2660);
  uVar73 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_29a0 = uVar73 ^ 0x20;
  local_29a8 = uVar70 ^ 0x20;
  local_29b0 = uVar66 ^ 0x20;
  iVar61 = (tray->tnear).field_0.i[k];
  local_2940._4_4_ = iVar61;
  local_2940._0_4_ = iVar61;
  local_2940._8_4_ = iVar61;
  local_2940._12_4_ = iVar61;
  local_2940._16_4_ = iVar61;
  local_2940._20_4_ = iVar61;
  local_2940._24_4_ = iVar61;
  local_2940._28_4_ = iVar61;
  auVar146 = ZEXT3264(local_2940);
  iVar61 = (tray->tfar).field_0.i[k];
  auVar80 = ZEXT3264(CONCAT428(iVar61,CONCAT424(iVar61,CONCAT420(iVar61,CONCAT416(iVar61,CONCAT412(
                                                  iVar61,CONCAT48(iVar61,CONCAT44(iVar61,iVar61)))))
                                               )));
  local_2520._16_16_ = mm_lookupmask_ps._240_16_;
  local_2520._0_16_ = mm_lookupmask_ps._0_16_;
  local_29b8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = &DAT_3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar98._16_4_ = 0x3f800000;
  auVar98._20_4_ = 0x3f800000;
  auVar98._24_4_ = 0x3f800000;
  auVar98._28_4_ = 0x3f800000;
  auVar85._8_4_ = 0xbf800000;
  auVar85._0_8_ = 0xbf800000bf800000;
  auVar85._12_4_ = 0xbf800000;
  auVar85._16_4_ = 0xbf800000;
  auVar85._20_4_ = 0xbf800000;
  auVar85._24_4_ = 0xbf800000;
  auVar85._28_4_ = 0xbf800000;
  _local_2540 = vblendvps_avx(auVar98,auVar85,local_2520);
  do {
    do {
      do {
        if (pauVar72 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar71 = pauVar72 + -1;
        pauVar72 = pauVar72 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar71 + 8));
      uVar76 = *(ulong *)*pauVar72;
      do {
        auVar90 = auVar124._0_32_;
        auVar98 = auVar120._0_32_;
        auVar85 = auVar119._0_32_;
        if ((uVar76 & 8) == 0) {
          auVar32 = vsubps_avx(*(undefined1 (*) [32])(uVar76 + 0x40 + uVar73),auVar85);
          auVar33._4_4_ = auVar133._4_4_ * auVar32._4_4_;
          auVar33._0_4_ = auVar133._0_4_ * auVar32._0_4_;
          auVar33._8_4_ = auVar133._8_4_ * auVar32._8_4_;
          auVar33._12_4_ = auVar133._12_4_ * auVar32._12_4_;
          auVar33._16_4_ = auVar133._16_4_ * auVar32._16_4_;
          auVar33._20_4_ = auVar133._20_4_ * auVar32._20_4_;
          auVar33._24_4_ = auVar133._24_4_ * auVar32._24_4_;
          auVar33._28_4_ = auVar32._28_4_;
          auVar32 = vsubps_avx(*(undefined1 (*) [32])(uVar76 + 0x40 + uVar70),auVar98);
          auVar34._4_4_ = auVar136._4_4_ * auVar32._4_4_;
          auVar34._0_4_ = auVar136._0_4_ * auVar32._0_4_;
          auVar34._8_4_ = auVar136._8_4_ * auVar32._8_4_;
          auVar34._12_4_ = auVar136._12_4_ * auVar32._12_4_;
          auVar34._16_4_ = auVar136._16_4_ * auVar32._16_4_;
          auVar34._20_4_ = auVar136._20_4_ * auVar32._20_4_;
          auVar34._24_4_ = auVar136._24_4_ * auVar32._24_4_;
          auVar34._28_4_ = auVar32._28_4_;
          auVar32 = vmaxps_avx(auVar33,auVar34);
          auVar33 = vsubps_avx(*(undefined1 (*) [32])(uVar76 + 0x40 + uVar66),auVar90);
          auVar35._4_4_ = auVar139._4_4_ * auVar33._4_4_;
          auVar35._0_4_ = auVar139._0_4_ * auVar33._0_4_;
          auVar35._8_4_ = auVar139._8_4_ * auVar33._8_4_;
          auVar35._12_4_ = auVar139._12_4_ * auVar33._12_4_;
          auVar35._16_4_ = auVar139._16_4_ * auVar33._16_4_;
          auVar35._20_4_ = auVar139._20_4_ * auVar33._20_4_;
          auVar35._24_4_ = auVar139._24_4_ * auVar33._24_4_;
          auVar35._28_4_ = auVar33._28_4_;
          auVar33 = vmaxps_avx(auVar35,auVar146._0_32_);
          local_2820 = vmaxps_avx(auVar32,auVar33);
          auVar32 = vsubps_avx(*(undefined1 (*) [32])(uVar76 + 0x40 + local_29a0),auVar85);
          auVar36._4_4_ = auVar140._4_4_ * auVar32._4_4_;
          auVar36._0_4_ = auVar140._0_4_ * auVar32._0_4_;
          auVar36._8_4_ = auVar140._8_4_ * auVar32._8_4_;
          auVar36._12_4_ = auVar140._12_4_ * auVar32._12_4_;
          auVar36._16_4_ = auVar140._16_4_ * auVar32._16_4_;
          auVar36._20_4_ = auVar140._20_4_ * auVar32._20_4_;
          auVar36._24_4_ = auVar140._24_4_ * auVar32._24_4_;
          auVar36._28_4_ = auVar32._28_4_;
          auVar32 = vsubps_avx(*(undefined1 (*) [32])(uVar76 + 0x40 + local_29a8),auVar98);
          auVar39._4_4_ = auVar142._4_4_ * auVar32._4_4_;
          auVar39._0_4_ = auVar142._0_4_ * auVar32._0_4_;
          auVar39._8_4_ = auVar142._8_4_ * auVar32._8_4_;
          auVar39._12_4_ = auVar142._12_4_ * auVar32._12_4_;
          auVar39._16_4_ = auVar142._16_4_ * auVar32._16_4_;
          auVar39._20_4_ = auVar142._20_4_ * auVar32._20_4_;
          auVar39._24_4_ = auVar142._24_4_ * auVar32._24_4_;
          auVar39._28_4_ = auVar32._28_4_;
          auVar32 = vminps_avx(auVar36,auVar39);
          auVar33 = vsubps_avx(*(undefined1 (*) [32])(uVar76 + 0x40 + local_29b0),auVar90);
          auVar40._4_4_ = auVar144._4_4_ * auVar33._4_4_;
          auVar40._0_4_ = auVar144._0_4_ * auVar33._0_4_;
          auVar40._8_4_ = auVar144._8_4_ * auVar33._8_4_;
          auVar40._12_4_ = auVar144._12_4_ * auVar33._12_4_;
          auVar40._16_4_ = auVar144._16_4_ * auVar33._16_4_;
          auVar40._20_4_ = auVar144._20_4_ * auVar33._20_4_;
          auVar40._24_4_ = auVar144._24_4_ * auVar33._24_4_;
          auVar40._28_4_ = auVar33._28_4_;
          auVar33 = vminps_avx(auVar40,auVar80._0_32_);
          auVar32 = vminps_avx(auVar32,auVar33);
          auVar32 = vcmpps_avx(local_2820,auVar32,2);
          uVar74 = vmovmskps_avx(auVar32);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar74);
        }
        if ((uVar76 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar61 = 4;
          }
          else {
            uVar75 = uVar76 & 0xfffffffffffffff0;
            lVar65 = 0;
            for (uVar76 = unaff_R12; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
              lVar65 = lVar65 + 1;
            }
            iVar61 = 0;
            uVar68 = unaff_R12 - 1 & unaff_R12;
            uVar76 = *(ulong *)(uVar75 + lVar65 * 8);
            if (uVar68 != 0) {
              uVar63 = *(uint *)(local_2820 + lVar65 * 4);
              lVar65 = 0;
              for (uVar38 = uVar68; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                lVar65 = lVar65 + 1;
              }
              uVar68 = uVar68 - 1 & uVar68;
              uVar38 = *(ulong *)(uVar75 + lVar65 * 8);
              uVar62 = *(uint *)(local_2820 + lVar65 * 4);
              if (uVar68 == 0) {
                if (uVar63 < uVar62) {
                  *(ulong *)*pauVar72 = uVar38;
                  *(uint *)(*pauVar72 + 8) = uVar62;
                  pauVar72 = pauVar72 + 1;
                }
                else {
                  *(ulong *)*pauVar72 = uVar76;
                  *(uint *)(*pauVar72 + 8) = uVar63;
                  pauVar72 = pauVar72 + 1;
                  uVar76 = uVar38;
                }
              }
              else {
                auVar81._8_8_ = 0;
                auVar81._0_8_ = uVar76;
                auVar81 = vpunpcklqdq_avx(auVar81,ZEXT416(uVar63));
                auVar92._8_8_ = 0;
                auVar92._0_8_ = uVar38;
                auVar92 = vpunpcklqdq_avx(auVar92,ZEXT416(uVar62));
                lVar65 = 0;
                for (uVar76 = uVar68; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000)
                {
                  lVar65 = lVar65 + 1;
                }
                uVar68 = uVar68 - 1 & uVar68;
                auVar96._8_8_ = 0;
                auVar96._0_8_ = *(ulong *)(uVar75 + lVar65 * 8);
                auVar82 = vpunpcklqdq_avx(auVar96,ZEXT416(*(uint *)(local_2820 + lVar65 * 4)));
                auVar96 = vpcmpgtd_avx(auVar92,auVar81);
                if (uVar68 == 0) {
                  auVar109 = vpshufd_avx(auVar96,0xaa);
                  auVar96 = vblendvps_avx(auVar92,auVar81,auVar109);
                  auVar81 = vblendvps_avx(auVar81,auVar92,auVar109);
                  auVar92 = vpcmpgtd_avx(auVar82,auVar96);
                  auVar109 = vpshufd_avx(auVar92,0xaa);
                  auVar92 = vblendvps_avx(auVar82,auVar96,auVar109);
                  auVar96 = vblendvps_avx(auVar96,auVar82,auVar109);
                  auVar82 = vpcmpgtd_avx(auVar96,auVar81);
                  auVar109 = vpshufd_avx(auVar82,0xaa);
                  auVar82 = vblendvps_avx(auVar96,auVar81,auVar109);
                  auVar81 = vblendvps_avx(auVar81,auVar96,auVar109);
                  *pauVar72 = auVar81;
                  pauVar72[1] = auVar82;
                  uVar76 = auVar92._0_8_;
                  pauVar72 = pauVar72 + 2;
                }
                else {
                  lVar65 = 0;
                  for (uVar76 = uVar68; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000
                      ) {
                    lVar65 = lVar65 + 1;
                  }
                  uVar68 = uVar68 - 1 & uVar68;
                  auVar109._8_8_ = 0;
                  auVar109._0_8_ = *(ulong *)(uVar75 + lVar65 * 8);
                  auVar109 = vpunpcklqdq_avx(auVar109,ZEXT416(*(uint *)(local_2820 + lVar65 * 4)));
                  if (uVar68 == 0) {
                    auVar83 = vpshufd_avx(auVar96,0xaa);
                    auVar96 = vblendvps_avx(auVar92,auVar81,auVar83);
                    auVar81 = vblendvps_avx(auVar81,auVar92,auVar83);
                    auVar92 = vpcmpgtd_avx(auVar109,auVar82);
                    auVar83 = vpshufd_avx(auVar92,0xaa);
                    auVar92 = vblendvps_avx(auVar109,auVar82,auVar83);
                    auVar82 = vblendvps_avx(auVar82,auVar109,auVar83);
                    auVar109 = vpcmpgtd_avx(auVar82,auVar81);
                    auVar83 = vpshufd_avx(auVar109,0xaa);
                    auVar109 = vblendvps_avx(auVar82,auVar81,auVar83);
                    auVar81 = vblendvps_avx(auVar81,auVar82,auVar83);
                    auVar82 = vpcmpgtd_avx(auVar92,auVar96);
                    auVar83 = vpshufd_avx(auVar82,0xaa);
                    auVar82 = vblendvps_avx(auVar92,auVar96,auVar83);
                    auVar92 = vblendvps_avx(auVar96,auVar92,auVar83);
                    auVar96 = vpcmpgtd_avx(auVar109,auVar92);
                    auVar83 = vpshufd_avx(auVar96,0xaa);
                    auVar96 = vblendvps_avx(auVar109,auVar92,auVar83);
                    auVar92 = vblendvps_avx(auVar92,auVar109,auVar83);
                    *pauVar72 = auVar81;
                    pauVar72[1] = auVar92;
                    pauVar72[2] = auVar96;
                    uVar76 = auVar82._0_8_;
                    pauVar71 = pauVar72 + 3;
                  }
                  else {
                    *pauVar72 = auVar81;
                    pauVar72[1] = auVar92;
                    pauVar72[2] = auVar82;
                    pauVar72[3] = auVar109;
                    lVar65 = 0x30;
                    do {
                      lVar64 = lVar65;
                      lVar65 = 0;
                      for (uVar76 = uVar68; (uVar76 & 1) == 0;
                          uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                        lVar65 = lVar65 + 1;
                      }
                      auVar82._8_8_ = 0;
                      auVar82._0_8_ = *(ulong *)(uVar75 + lVar65 * 8);
                      auVar81 = vpunpcklqdq_avx(auVar82,ZEXT416(*(uint *)(local_2820 + lVar65 * 4)))
                      ;
                      *(undefined1 (*) [16])(pauVar72[1] + lVar64) = auVar81;
                      uVar68 = uVar68 - 1 & uVar68;
                      lVar65 = lVar64 + 0x10;
                    } while (uVar68 != 0);
                    pauVar71 = (undefined1 (*) [16])(pauVar72[1] + lVar64);
                    if (lVar64 + 0x10 != 0) {
                      lVar65 = 0x10;
                      pauVar67 = pauVar72;
                      do {
                        auVar81 = pauVar67[1];
                        uVar63 = *(uint *)(pauVar67[1] + 8);
                        pauVar67 = pauVar67 + 1;
                        lVar64 = lVar65;
                        do {
                          if (uVar63 <= *(uint *)(pauVar72[-1] + lVar64 + 8)) {
                            pauVar69 = (undefined1 (*) [16])(*pauVar72 + lVar64);
                            break;
                          }
                          *(undefined1 (*) [16])(*pauVar72 + lVar64) =
                               *(undefined1 (*) [16])(pauVar72[-1] + lVar64);
                          lVar64 = lVar64 + -0x10;
                          pauVar69 = pauVar72;
                        } while (lVar64 != 0);
                        *pauVar69 = auVar81;
                        lVar65 = lVar65 + 0x10;
                      } while (pauVar71 != pauVar67);
                    }
                    uVar76 = *(ulong *)*pauVar71;
                  }
                  auVar119 = ZEXT3264(auVar85);
                  auVar120 = ZEXT3264(auVar98);
                  auVar124 = ZEXT3264(auVar90);
                  auVar133 = ZEXT3264(auVar133._0_32_);
                  auVar136 = ZEXT3264(auVar136._0_32_);
                  auVar139 = ZEXT3264(auVar139._0_32_);
                  auVar140 = ZEXT3264(auVar140._0_32_);
                  auVar142 = ZEXT3264(auVar142._0_32_);
                  auVar144 = ZEXT3264(auVar144._0_32_);
                  auVar146 = ZEXT3264(local_2940);
                  pauVar72 = pauVar71;
                  iVar61 = 0;
                }
              }
            }
          }
        }
        else {
          iVar61 = 6;
        }
      } while (iVar61 == 0);
    } while (iVar61 != 6);
    uVar75 = (ulong)((uint)uVar76 & 0xf);
    if (uVar75 != 8) {
      uVar76 = uVar76 & 0xfffffffffffffff0;
      local_2998 = 0;
      do {
        lVar64 = local_2998 * 0x60;
        pSVar5 = context->scene;
        ppfVar6 = (pSVar5->vertices).items;
        pfVar7 = ppfVar6[*(uint *)(uVar76 + 0x40 + lVar64)];
        auVar93._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar76 + 0x20 + lVar64));
        auVar93._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar76 + lVar64));
        pfVar8 = ppfVar6[*(uint *)(uVar76 + 0x48 + lVar64)];
        auVar99._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar76 + 0x28 + lVar64));
        auVar99._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar76 + 8 + lVar64));
        pfVar9 = ppfVar6[*(uint *)(uVar76 + 0x44 + lVar64)];
        auVar110._16_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar76 + 0x24 + lVar64));
        auVar110._0_16_ = *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar76 + 4 + lVar64));
        pfVar10 = ppfVar6[*(uint *)(uVar76 + 0x4c + lVar64)];
        auVar131._16_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar76 + 0x2c + lVar64));
        auVar131._0_16_ = *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar76 + 0xc + lVar64));
        lVar65 = uVar76 + 0x40 + lVar64;
        local_23c0 = *(undefined8 *)(lVar65 + 0x10);
        uStack_23b8 = *(undefined8 *)(lVar65 + 0x18);
        uStack_23b0 = local_23c0;
        uStack_23a8 = uStack_23b8;
        lVar65 = uVar76 + 0x50 + lVar64;
        local_28e0 = *(undefined8 *)(lVar65 + 0x10);
        uStack_28d8 = *(undefined8 *)(lVar65 + 0x18);
        auVar96 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar76 + 0x10 + lVar64)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar76 + 0x18 + lVar64)));
        auVar81 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar76 + 0x10 + lVar64)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar76 + 0x18 + lVar64)));
        auVar82 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar76 + 0x14 + lVar64)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar76 + 0x1c + lVar64)))
        ;
        auVar92 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar76 + 0x14 + lVar64)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar76 + 0x1c + lVar64)))
        ;
        auVar109 = vunpcklps_avx(auVar81,auVar92);
        auVar83 = vunpcklps_avx(auVar96,auVar82);
        auVar81 = vunpckhps_avx(auVar96,auVar82);
        auVar82 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar76 + 0x30 + lVar64)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar76 + 0x38 + lVar64)));
        auVar92 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar76 + 0x30 + lVar64)),
                                *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar76 + 0x38 + lVar64)));
        auVar97 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar76 + 0x34 + lVar64)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar76 + 0x3c + lVar64)))
        ;
        auVar96 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar76 + 0x34 + lVar64)),
                                *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar76 + 0x3c + lVar64)))
        ;
        auVar96 = vunpcklps_avx(auVar92,auVar96);
        auVar37 = vunpcklps_avx(auVar82,auVar97);
        auVar92 = vunpckhps_avx(auVar82,auVar97);
        uStack_28d0 = local_28e0;
        uStack_28c8 = uStack_28d8;
        auVar85 = vunpcklps_avx(auVar110,auVar131);
        auVar98 = vunpcklps_avx(auVar93,auVar99);
        auVar32 = vunpcklps_avx(auVar98,auVar85);
        auVar85 = vunpckhps_avx(auVar98,auVar85);
        auVar98 = vunpckhps_avx(auVar110,auVar131);
        auVar90 = vunpckhps_avx(auVar93,auVar99);
        auVar98 = vunpcklps_avx(auVar90,auVar98);
        auVar100._16_16_ = auVar83;
        auVar100._0_16_ = auVar83;
        auVar111._16_16_ = auVar81;
        auVar111._0_16_ = auVar81;
        auVar86._16_16_ = auVar109;
        auVar86._0_16_ = auVar109;
        auVar145._16_16_ = auVar37;
        auVar145._0_16_ = auVar37;
        auVar103._16_16_ = auVar92;
        auVar103._0_16_ = auVar92;
        uVar74 = *(undefined4 *)(ray + k * 4);
        auVar122._4_4_ = uVar74;
        auVar122._0_4_ = uVar74;
        auVar122._8_4_ = uVar74;
        auVar122._12_4_ = uVar74;
        auVar122._16_4_ = uVar74;
        auVar122._20_4_ = uVar74;
        auVar122._24_4_ = uVar74;
        auVar122._28_4_ = uVar74;
        uVar74 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar137._4_4_ = uVar74;
        auVar137._0_4_ = uVar74;
        auVar137._8_4_ = uVar74;
        auVar137._12_4_ = uVar74;
        auVar137._16_4_ = uVar74;
        auVar137._20_4_ = uVar74;
        auVar137._24_4_ = uVar74;
        auVar137._28_4_ = uVar74;
        auVar77._16_16_ = auVar96;
        auVar77._0_16_ = auVar96;
        uVar74 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar141._4_4_ = uVar74;
        auVar141._0_4_ = uVar74;
        auVar141._8_4_ = uVar74;
        auVar141._12_4_ = uVar74;
        auVar141._16_4_ = uVar74;
        auVar141._20_4_ = uVar74;
        auVar141._24_4_ = uVar74;
        auVar141._28_4_ = uVar74;
        local_2900 = vsubps_avx(auVar32,auVar122);
        local_2920 = vsubps_avx(auVar85,auVar137);
        local_23e0 = vsubps_avx(auVar98,auVar141);
        auVar85 = vsubps_avx(auVar100,auVar122);
        auVar98 = vsubps_avx(auVar111,auVar137);
        auVar90 = vsubps_avx(auVar86,auVar141);
        auVar32 = vsubps_avx(auVar145,auVar122);
        auVar33 = vsubps_avx(auVar103,auVar137);
        auVar34 = vsubps_avx(auVar77,auVar141);
        local_2400 = vsubps_avx(auVar32,local_2900);
        local_2440 = vsubps_avx(auVar33,local_2920);
        local_2420 = vsubps_avx(auVar34,local_23e0);
        auVar78._0_4_ = local_2900._0_4_ + auVar32._0_4_;
        auVar78._4_4_ = local_2900._4_4_ + auVar32._4_4_;
        auVar78._8_4_ = local_2900._8_4_ + auVar32._8_4_;
        auVar78._12_4_ = local_2900._12_4_ + auVar32._12_4_;
        auVar78._16_4_ = local_2900._16_4_ + auVar32._16_4_;
        auVar78._20_4_ = local_2900._20_4_ + auVar32._20_4_;
        auVar78._24_4_ = local_2900._24_4_ + auVar32._24_4_;
        auVar78._28_4_ = local_2900._28_4_ + auVar32._28_4_;
        auVar94._0_4_ = local_2920._0_4_ + auVar33._0_4_;
        auVar94._4_4_ = local_2920._4_4_ + auVar33._4_4_;
        auVar94._8_4_ = local_2920._8_4_ + auVar33._8_4_;
        auVar94._12_4_ = local_2920._12_4_ + auVar33._12_4_;
        auVar94._16_4_ = local_2920._16_4_ + auVar33._16_4_;
        auVar94._20_4_ = local_2920._20_4_ + auVar33._20_4_;
        auVar94._24_4_ = local_2920._24_4_ + auVar33._24_4_;
        auVar94._28_4_ = local_2920._28_4_ + auVar33._28_4_;
        fVar1 = local_23e0._0_4_;
        auVar104._0_4_ = auVar34._0_4_ + fVar1;
        fVar2 = local_23e0._4_4_;
        auVar104._4_4_ = auVar34._4_4_ + fVar2;
        fVar3 = local_23e0._8_4_;
        auVar104._8_4_ = auVar34._8_4_ + fVar3;
        fVar31 = local_23e0._12_4_;
        auVar104._12_4_ = auVar34._12_4_ + fVar31;
        fVar13 = local_23e0._16_4_;
        auVar104._16_4_ = auVar34._16_4_ + fVar13;
        fVar14 = local_23e0._20_4_;
        auVar104._20_4_ = auVar34._20_4_ + fVar14;
        fVar15 = local_23e0._24_4_;
        auVar104._24_4_ = auVar34._24_4_ + fVar15;
        fVar108 = local_23e0._28_4_;
        auVar104._28_4_ = auVar34._28_4_ + fVar108;
        auVar41._4_4_ = local_2420._4_4_ * auVar94._4_4_;
        auVar41._0_4_ = local_2420._0_4_ * auVar94._0_4_;
        auVar41._8_4_ = local_2420._8_4_ * auVar94._8_4_;
        auVar41._12_4_ = local_2420._12_4_ * auVar94._12_4_;
        auVar41._16_4_ = local_2420._16_4_ * auVar94._16_4_;
        auVar41._20_4_ = local_2420._20_4_ * auVar94._20_4_;
        auVar41._24_4_ = local_2420._24_4_ * auVar94._24_4_;
        auVar41._28_4_ = uVar74;
        auVar92 = vfmsub231ps_fma(auVar41,local_2440,auVar104);
        auVar42._4_4_ = local_2400._4_4_ * auVar104._4_4_;
        auVar42._0_4_ = local_2400._0_4_ * auVar104._0_4_;
        auVar42._8_4_ = local_2400._8_4_ * auVar104._8_4_;
        auVar42._12_4_ = local_2400._12_4_ * auVar104._12_4_;
        auVar42._16_4_ = local_2400._16_4_ * auVar104._16_4_;
        auVar42._20_4_ = local_2400._20_4_ * auVar104._20_4_;
        auVar42._24_4_ = local_2400._24_4_ * auVar104._24_4_;
        auVar42._28_4_ = auVar104._28_4_;
        auVar81 = vfmsub231ps_fma(auVar42,local_2420,auVar78);
        auVar43._4_4_ = local_2440._4_4_ * auVar78._4_4_;
        auVar43._0_4_ = local_2440._0_4_ * auVar78._0_4_;
        auVar43._8_4_ = local_2440._8_4_ * auVar78._8_4_;
        auVar43._12_4_ = local_2440._12_4_ * auVar78._12_4_;
        auVar43._16_4_ = local_2440._16_4_ * auVar78._16_4_;
        auVar43._20_4_ = local_2440._20_4_ * auVar78._20_4_;
        auVar43._24_4_ = local_2440._24_4_ * auVar78._24_4_;
        auVar43._28_4_ = auVar78._28_4_;
        auVar96 = vfmsub231ps_fma(auVar43,local_2400,auVar94);
        uVar74 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar138._4_4_ = uVar74;
        auVar138._0_4_ = uVar74;
        auVar138._8_4_ = uVar74;
        auVar138._12_4_ = uVar74;
        auVar138._16_4_ = uVar74;
        auVar138._20_4_ = uVar74;
        auVar138._24_4_ = uVar74;
        auVar138._28_4_ = uVar74;
        local_2480 = *(float *)(ray + k * 4 + 0x60);
        auVar44._4_4_ = local_2480 * auVar96._4_4_;
        auVar44._0_4_ = local_2480 * auVar96._0_4_;
        auVar44._8_4_ = local_2480 * auVar96._8_4_;
        auVar44._12_4_ = local_2480 * auVar96._12_4_;
        auVar44._16_4_ = local_2480 * 0.0;
        auVar44._20_4_ = local_2480 * 0.0;
        auVar44._24_4_ = local_2480 * 0.0;
        auVar44._28_4_ = auVar94._28_4_;
        auVar81 = vfmadd231ps_fma(auVar44,auVar138,ZEXT1632(auVar81));
        uVar74 = *(undefined4 *)(ray + k * 4 + 0x40);
        local_2460._4_4_ = uVar74;
        local_2460._0_4_ = uVar74;
        local_2460._8_4_ = uVar74;
        local_2460._12_4_ = uVar74;
        local_2460._16_4_ = uVar74;
        local_2460._20_4_ = uVar74;
        local_2460._24_4_ = uVar74;
        local_2460._28_4_ = uVar74;
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_2460,ZEXT1632(auVar92));
        local_24a0 = vsubps_avx(local_2920,auVar98);
        local_24c0 = vsubps_avx(local_23e0,auVar90);
        auVar143._0_4_ = local_2920._0_4_ + auVar98._0_4_;
        auVar143._4_4_ = local_2920._4_4_ + auVar98._4_4_;
        auVar143._8_4_ = local_2920._8_4_ + auVar98._8_4_;
        auVar143._12_4_ = local_2920._12_4_ + auVar98._12_4_;
        auVar143._16_4_ = local_2920._16_4_ + auVar98._16_4_;
        auVar143._20_4_ = local_2920._20_4_ + auVar98._20_4_;
        auVar143._24_4_ = local_2920._24_4_ + auVar98._24_4_;
        auVar143._28_4_ = local_2920._28_4_ + auVar98._28_4_;
        auVar105._0_4_ = fVar1 + auVar90._0_4_;
        auVar105._4_4_ = fVar2 + auVar90._4_4_;
        auVar105._8_4_ = fVar3 + auVar90._8_4_;
        auVar105._12_4_ = fVar31 + auVar90._12_4_;
        auVar105._16_4_ = fVar13 + auVar90._16_4_;
        auVar105._20_4_ = fVar14 + auVar90._20_4_;
        auVar105._24_4_ = fVar15 + auVar90._24_4_;
        fVar121 = auVar90._28_4_;
        auVar105._28_4_ = fVar108 + fVar121;
        fVar113 = local_24c0._0_4_;
        fVar115 = local_24c0._4_4_;
        auVar45._4_4_ = auVar143._4_4_ * fVar115;
        auVar45._0_4_ = auVar143._0_4_ * fVar113;
        fVar16 = local_24c0._8_4_;
        auVar45._8_4_ = auVar143._8_4_ * fVar16;
        fVar19 = local_24c0._12_4_;
        auVar45._12_4_ = auVar143._12_4_ * fVar19;
        fVar22 = local_24c0._16_4_;
        auVar45._16_4_ = auVar143._16_4_ * fVar22;
        fVar25 = local_24c0._20_4_;
        auVar45._20_4_ = auVar143._20_4_ * fVar25;
        fVar28 = local_24c0._24_4_;
        auVar45._24_4_ = auVar143._24_4_ * fVar28;
        auVar45._28_4_ = fVar108;
        auVar96 = vfmsub231ps_fma(auVar45,local_24a0,auVar105);
        auVar35 = vsubps_avx(local_2900,auVar85);
        fVar108 = auVar35._0_4_;
        fVar116 = auVar35._4_4_;
        auVar46._4_4_ = auVar105._4_4_ * fVar116;
        auVar46._0_4_ = auVar105._0_4_ * fVar108;
        fVar17 = auVar35._8_4_;
        auVar46._8_4_ = auVar105._8_4_ * fVar17;
        fVar20 = auVar35._12_4_;
        auVar46._12_4_ = auVar105._12_4_ * fVar20;
        fVar23 = auVar35._16_4_;
        auVar46._16_4_ = auVar105._16_4_ * fVar23;
        fVar26 = auVar35._20_4_;
        auVar46._20_4_ = auVar105._20_4_ * fVar26;
        fVar29 = auVar35._24_4_;
        auVar46._24_4_ = auVar105._24_4_ * fVar29;
        auVar46._28_4_ = auVar105._28_4_;
        auVar134._0_4_ = local_2900._0_4_ + auVar85._0_4_;
        auVar134._4_4_ = local_2900._4_4_ + auVar85._4_4_;
        auVar134._8_4_ = local_2900._8_4_ + auVar85._8_4_;
        auVar134._12_4_ = local_2900._12_4_ + auVar85._12_4_;
        auVar134._16_4_ = local_2900._16_4_ + auVar85._16_4_;
        auVar134._20_4_ = local_2900._20_4_ + auVar85._20_4_;
        auVar134._24_4_ = local_2900._24_4_ + auVar85._24_4_;
        auVar134._28_4_ = local_2900._28_4_ + auVar85._28_4_;
        auVar92 = vfmsub231ps_fma(auVar46,local_24c0,auVar134);
        fVar114 = local_24a0._0_4_;
        fVar117 = local_24a0._4_4_;
        auVar47._4_4_ = auVar134._4_4_ * fVar117;
        auVar47._0_4_ = auVar134._0_4_ * fVar114;
        fVar18 = local_24a0._8_4_;
        auVar47._8_4_ = auVar134._8_4_ * fVar18;
        fVar21 = local_24a0._12_4_;
        auVar47._12_4_ = auVar134._12_4_ * fVar21;
        fVar24 = local_24a0._16_4_;
        auVar47._16_4_ = auVar134._16_4_ * fVar24;
        fVar27 = local_24a0._20_4_;
        auVar47._20_4_ = auVar134._20_4_ * fVar27;
        fVar30 = local_24a0._24_4_;
        auVar47._24_4_ = auVar134._24_4_ * fVar30;
        auVar47._28_4_ = local_24c0._28_4_;
        auVar82 = vfmsub231ps_fma(auVar47,auVar35,auVar143);
        auVar48._4_4_ = auVar82._4_4_ * local_2480;
        auVar48._0_4_ = auVar82._0_4_ * local_2480;
        auVar48._8_4_ = auVar82._8_4_ * local_2480;
        auVar48._12_4_ = auVar82._12_4_ * local_2480;
        auVar48._16_4_ = local_2480 * 0.0;
        auVar48._20_4_ = local_2480 * 0.0;
        auVar48._24_4_ = local_2480 * 0.0;
        auVar48._28_4_ = auVar143._28_4_;
        auVar92 = vfmadd231ps_fma(auVar48,auVar138,ZEXT1632(auVar92));
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_2460,ZEXT1632(auVar96));
        auVar36 = vsubps_avx(auVar85,auVar32);
        auVar101._0_4_ = auVar85._0_4_ + auVar32._0_4_;
        auVar101._4_4_ = auVar85._4_4_ + auVar32._4_4_;
        auVar101._8_4_ = auVar85._8_4_ + auVar32._8_4_;
        auVar101._12_4_ = auVar85._12_4_ + auVar32._12_4_;
        auVar101._16_4_ = auVar85._16_4_ + auVar32._16_4_;
        auVar101._20_4_ = auVar85._20_4_ + auVar32._20_4_;
        auVar101._24_4_ = auVar85._24_4_ + auVar32._24_4_;
        auVar101._28_4_ = auVar85._28_4_ + auVar32._28_4_;
        auVar32 = vsubps_avx(auVar98,auVar33);
        auVar112._0_4_ = auVar98._0_4_ + auVar33._0_4_;
        auVar112._4_4_ = auVar98._4_4_ + auVar33._4_4_;
        auVar112._8_4_ = auVar98._8_4_ + auVar33._8_4_;
        auVar112._12_4_ = auVar98._12_4_ + auVar33._12_4_;
        auVar112._16_4_ = auVar98._16_4_ + auVar33._16_4_;
        auVar112._20_4_ = auVar98._20_4_ + auVar33._20_4_;
        auVar112._24_4_ = auVar98._24_4_ + auVar33._24_4_;
        auVar112._28_4_ = auVar98._28_4_ + auVar33._28_4_;
        auVar33 = vsubps_avx(auVar90,auVar34);
        auVar87._0_4_ = auVar90._0_4_ + auVar34._0_4_;
        auVar87._4_4_ = auVar90._4_4_ + auVar34._4_4_;
        auVar87._8_4_ = auVar90._8_4_ + auVar34._8_4_;
        auVar87._12_4_ = auVar90._12_4_ + auVar34._12_4_;
        auVar87._16_4_ = auVar90._16_4_ + auVar34._16_4_;
        auVar87._20_4_ = auVar90._20_4_ + auVar34._20_4_;
        auVar87._24_4_ = auVar90._24_4_ + auVar34._24_4_;
        auVar87._28_4_ = fVar121 + auVar34._28_4_;
        auVar90._4_4_ = auVar33._4_4_ * auVar112._4_4_;
        auVar90._0_4_ = auVar33._0_4_ * auVar112._0_4_;
        auVar90._8_4_ = auVar33._8_4_ * auVar112._8_4_;
        auVar90._12_4_ = auVar33._12_4_ * auVar112._12_4_;
        auVar90._16_4_ = auVar33._16_4_ * auVar112._16_4_;
        auVar90._20_4_ = auVar33._20_4_ * auVar112._20_4_;
        auVar90._24_4_ = auVar33._24_4_ * auVar112._24_4_;
        auVar90._28_4_ = fVar121;
        auVar82 = vfmsub231ps_fma(auVar90,auVar32,auVar87);
        auVar49._4_4_ = auVar87._4_4_ * auVar36._4_4_;
        auVar49._0_4_ = auVar87._0_4_ * auVar36._0_4_;
        auVar49._8_4_ = auVar87._8_4_ * auVar36._8_4_;
        auVar49._12_4_ = auVar87._12_4_ * auVar36._12_4_;
        auVar49._16_4_ = auVar87._16_4_ * auVar36._16_4_;
        auVar49._20_4_ = auVar87._20_4_ * auVar36._20_4_;
        auVar49._24_4_ = auVar87._24_4_ * auVar36._24_4_;
        auVar49._28_4_ = auVar87._28_4_;
        auVar96 = vfmsub231ps_fma(auVar49,auVar33,auVar101);
        auVar50._4_4_ = auVar32._4_4_ * auVar101._4_4_;
        auVar50._0_4_ = auVar32._0_4_ * auVar101._0_4_;
        auVar50._8_4_ = auVar32._8_4_ * auVar101._8_4_;
        auVar50._12_4_ = auVar32._12_4_ * auVar101._12_4_;
        auVar50._16_4_ = auVar32._16_4_ * auVar101._16_4_;
        auVar50._20_4_ = auVar32._20_4_ * auVar101._20_4_;
        auVar50._24_4_ = auVar32._24_4_ * auVar101._24_4_;
        auVar50._28_4_ = auVar101._28_4_;
        auVar109 = vfmsub231ps_fma(auVar50,auVar36,auVar112);
        fStack_247c = local_2480;
        fStack_2478 = local_2480;
        fStack_2474 = local_2480;
        fStack_2470 = local_2480;
        fStack_246c = local_2480;
        fStack_2468 = local_2480;
        fStack_2464 = local_2480;
        auVar102._0_4_ = local_2480 * auVar109._0_4_;
        auVar102._4_4_ = local_2480 * auVar109._4_4_;
        auVar102._8_4_ = local_2480 * auVar109._8_4_;
        auVar102._12_4_ = local_2480 * auVar109._12_4_;
        auVar102._16_4_ = local_2480 * 0.0;
        auVar102._20_4_ = local_2480 * 0.0;
        auVar102._24_4_ = local_2480 * 0.0;
        auVar102._28_4_ = 0;
        auVar96 = vfmadd231ps_fma(auVar102,auVar138,ZEXT1632(auVar96));
        auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),local_2460,ZEXT1632(auVar82));
        local_27e0 = ZEXT1632(CONCAT412(auVar96._12_4_ + auVar92._12_4_ + auVar81._12_4_,
                                        CONCAT48(auVar96._8_4_ + auVar92._8_4_ + auVar81._8_4_,
                                                 CONCAT44(auVar96._4_4_ +
                                                          auVar92._4_4_ + auVar81._4_4_,
                                                          auVar96._0_4_ +
                                                          auVar92._0_4_ + auVar81._0_4_))));
        auVar88._8_4_ = 0x7fffffff;
        auVar88._0_8_ = 0x7fffffff7fffffff;
        auVar88._12_4_ = 0x7fffffff;
        auVar88._16_4_ = 0x7fffffff;
        auVar88._20_4_ = 0x7fffffff;
        auVar88._24_4_ = 0x7fffffff;
        auVar88._28_4_ = 0x7fffffff;
        local_2800 = ZEXT1632(auVar92);
        auVar85 = vminps_avx(ZEXT1632(auVar81),local_2800);
        auVar85 = vminps_avx(auVar85,ZEXT1632(auVar96));
        local_2500 = vandps_avx(local_27e0,auVar88);
        fVar121 = local_2500._0_4_ * 1.1920929e-07;
        fVar125 = local_2500._4_4_ * 1.1920929e-07;
        auVar51._4_4_ = fVar125;
        auVar51._0_4_ = fVar121;
        fVar126 = local_2500._8_4_ * 1.1920929e-07;
        auVar51._8_4_ = fVar126;
        fVar127 = local_2500._12_4_ * 1.1920929e-07;
        auVar51._12_4_ = fVar127;
        fVar128 = local_2500._16_4_ * 1.1920929e-07;
        auVar51._16_4_ = fVar128;
        fVar129 = local_2500._20_4_ * 1.1920929e-07;
        auVar51._20_4_ = fVar129;
        fVar130 = local_2500._24_4_ * 1.1920929e-07;
        auVar51._24_4_ = fVar130;
        auVar51._28_4_ = 0x34000000;
        auVar118._0_8_ = CONCAT44(fVar125,fVar121) ^ 0x8000000080000000;
        auVar118._8_4_ = -fVar126;
        auVar118._12_4_ = -fVar127;
        auVar118._16_4_ = -fVar128;
        auVar118._20_4_ = -fVar129;
        auVar118._24_4_ = -fVar130;
        auVar118._28_4_ = 0xb4000000;
        auVar85 = vcmpps_avx(auVar85,auVar118,5);
        local_24e0 = ZEXT1632(auVar81);
        auVar90 = vmaxps_avx(ZEXT1632(auVar81),local_2800);
        auVar98 = vmaxps_avx(auVar90,ZEXT1632(auVar96));
        auVar98 = vcmpps_avx(auVar98,auVar51,2);
        auVar98 = vorps_avx(auVar85,auVar98);
        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0x7f,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar98 >> 0xbf,0) != '\0') ||
            (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar98[0x1f] < '\0') {
          auVar52._4_4_ = fVar117 * local_2420._4_4_;
          auVar52._0_4_ = fVar114 * local_2420._0_4_;
          auVar52._8_4_ = fVar18 * local_2420._8_4_;
          auVar52._12_4_ = fVar21 * local_2420._12_4_;
          auVar52._16_4_ = fVar24 * local_2420._16_4_;
          auVar52._20_4_ = fVar27 * local_2420._20_4_;
          auVar52._24_4_ = fVar30 * local_2420._24_4_;
          auVar52._28_4_ = auVar85._28_4_;
          auVar53._4_4_ = local_2440._4_4_ * fVar116;
          auVar53._0_4_ = local_2440._0_4_ * fVar108;
          auVar53._8_4_ = local_2440._8_4_ * fVar17;
          auVar53._12_4_ = local_2440._12_4_ * fVar20;
          auVar53._16_4_ = local_2440._16_4_ * fVar23;
          auVar53._20_4_ = local_2440._20_4_ * fVar26;
          auVar53._24_4_ = local_2440._24_4_ * fVar29;
          auVar53._28_4_ = 0x34000000;
          auVar96 = vfmsub213ps_fma(local_2440,local_24c0,auVar52);
          auVar54._4_4_ = auVar32._4_4_ * fVar115;
          auVar54._0_4_ = auVar32._0_4_ * fVar113;
          auVar54._8_4_ = auVar32._8_4_ * fVar16;
          auVar54._12_4_ = auVar32._12_4_ * fVar19;
          auVar54._16_4_ = auVar32._16_4_ * fVar22;
          auVar54._20_4_ = auVar32._20_4_ * fVar25;
          auVar54._24_4_ = auVar32._24_4_ * fVar28;
          auVar54._28_4_ = auVar90._28_4_;
          auVar55._4_4_ = auVar33._4_4_ * fVar116;
          auVar55._0_4_ = auVar33._0_4_ * fVar108;
          auVar55._8_4_ = auVar33._8_4_ * fVar17;
          auVar55._12_4_ = auVar33._12_4_ * fVar20;
          auVar55._16_4_ = auVar33._16_4_ * fVar23;
          auVar55._20_4_ = auVar33._20_4_ * fVar26;
          auVar55._24_4_ = auVar33._24_4_ * fVar29;
          auVar55._28_4_ = local_2500._28_4_;
          auVar82 = vfmsub213ps_fma(auVar33,local_24a0,auVar54);
          auVar85 = vandps_avx(auVar52,auVar88);
          auVar90 = vandps_avx(auVar54,auVar88);
          auVar85 = vcmpps_avx(auVar85,auVar90,1);
          local_27c0 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar96),auVar85);
          auVar56._4_4_ = fVar117 * auVar36._4_4_;
          auVar56._0_4_ = fVar114 * auVar36._0_4_;
          auVar56._8_4_ = fVar18 * auVar36._8_4_;
          auVar56._12_4_ = fVar21 * auVar36._12_4_;
          auVar56._16_4_ = fVar24 * auVar36._16_4_;
          auVar56._20_4_ = fVar27 * auVar36._20_4_;
          auVar56._24_4_ = fVar30 * auVar36._24_4_;
          auVar56._28_4_ = auVar85._28_4_;
          auVar96 = vfmsub213ps_fma(auVar36,local_24c0,auVar55);
          auVar57._4_4_ = local_2400._4_4_ * fVar115;
          auVar57._0_4_ = local_2400._0_4_ * fVar113;
          auVar57._8_4_ = local_2400._8_4_ * fVar16;
          auVar57._12_4_ = local_2400._12_4_ * fVar19;
          auVar57._16_4_ = local_2400._16_4_ * fVar22;
          auVar57._20_4_ = local_2400._20_4_ * fVar25;
          auVar57._24_4_ = local_2400._24_4_ * fVar28;
          auVar57._28_4_ = auVar90._28_4_;
          auVar82 = vfmsub213ps_fma(local_2420,auVar35,auVar57);
          auVar85 = vandps_avx(auVar57,auVar88);
          auVar90 = vandps_avx(auVar55,auVar88);
          auVar85 = vcmpps_avx(auVar85,auVar90,1);
          local_27a0 = vblendvps_avx(ZEXT1632(auVar96),ZEXT1632(auVar82),auVar85);
          auVar96 = vfmsub213ps_fma(local_2400,local_24a0,auVar53);
          auVar82 = vfmsub213ps_fma(auVar32,auVar35,auVar56);
          auVar85 = vandps_avx(auVar53,auVar88);
          auVar90 = vandps_avx(auVar56,auVar88);
          auVar90 = vcmpps_avx(auVar85,auVar90,1);
          local_2780 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar96),auVar90);
          auVar96 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
          fVar108 = local_2780._0_4_;
          auVar89._0_4_ = fVar108 * local_2480;
          fVar121 = local_2780._4_4_;
          auVar89._4_4_ = fVar121 * local_2480;
          fVar113 = local_2780._8_4_;
          auVar89._8_4_ = fVar113 * local_2480;
          fVar114 = local_2780._12_4_;
          auVar89._12_4_ = fVar114 * local_2480;
          fVar115 = local_2780._16_4_;
          auVar89._16_4_ = fVar115 * local_2480;
          fVar116 = local_2780._20_4_;
          auVar89._20_4_ = fVar116 * local_2480;
          fVar117 = local_2780._24_4_;
          auVar89._24_4_ = fVar117 * local_2480;
          auVar89._28_4_ = 0;
          auVar82 = vfmadd213ps_fma(auVar138,local_27a0,auVar89);
          auVar82 = vfmadd213ps_fma(local_2460,local_27c0,ZEXT1632(auVar82));
          auVar90 = ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                       CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                CONCAT44(auVar82._4_4_ + auVar82._4_4_,
                                                         auVar82._0_4_ + auVar82._0_4_))));
          auVar32._4_4_ = fVar121 * fVar2;
          auVar32._0_4_ = fVar108 * fVar1;
          auVar32._8_4_ = fVar113 * fVar3;
          auVar32._12_4_ = fVar114 * fVar31;
          auVar32._16_4_ = fVar115 * fVar13;
          auVar32._20_4_ = fVar116 * fVar14;
          auVar32._24_4_ = fVar117 * fVar15;
          auVar32._28_4_ = auVar85._28_4_;
          auVar82 = vfmadd213ps_fma(local_2920,local_27a0,auVar32);
          auVar109 = vfmadd213ps_fma(local_2900,local_27c0,ZEXT1632(auVar82));
          auVar85 = vrcpps_avx(auVar90);
          auVar135._8_4_ = 0x3f800000;
          auVar135._0_8_ = &DAT_3f8000003f800000;
          auVar135._12_4_ = 0x3f800000;
          auVar135._16_4_ = 0x3f800000;
          auVar135._20_4_ = 0x3f800000;
          auVar135._24_4_ = 0x3f800000;
          auVar135._28_4_ = 0x3f800000;
          auVar82 = vfnmadd213ps_fma(auVar85,auVar90,auVar135);
          auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar85,auVar85);
          local_2700._28_4_ = 0x3f800000;
          local_2700._0_28_ =
               ZEXT1628(CONCAT412(auVar82._12_4_ * (auVar109._12_4_ + auVar109._12_4_),
                                  CONCAT48(auVar82._8_4_ * (auVar109._8_4_ + auVar109._8_4_),
                                           CONCAT44(auVar82._4_4_ *
                                                    (auVar109._4_4_ + auVar109._4_4_),
                                                    auVar82._0_4_ *
                                                    (auVar109._0_4_ + auVar109._0_4_)))));
          auVar80 = ZEXT3264(local_2700);
          uVar74 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar106._4_4_ = uVar74;
          auVar106._0_4_ = uVar74;
          auVar106._8_4_ = uVar74;
          auVar106._12_4_ = uVar74;
          auVar106._16_4_ = uVar74;
          auVar106._20_4_ = uVar74;
          auVar106._24_4_ = uVar74;
          auVar106._28_4_ = uVar74;
          uVar74 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar123._4_4_ = uVar74;
          auVar123._0_4_ = uVar74;
          auVar123._8_4_ = uVar74;
          auVar123._12_4_ = uVar74;
          auVar123._16_4_ = uVar74;
          auVar123._20_4_ = uVar74;
          auVar123._24_4_ = uVar74;
          auVar123._28_4_ = uVar74;
          auVar85 = vcmpps_avx(auVar106,local_2700,2);
          auVar98 = vcmpps_avx(local_2700,auVar123,2);
          auVar85 = vandps_avx(auVar98,auVar85);
          auVar82 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
          auVar96 = vpand_avx(auVar82,auVar96);
          auVar85 = vpmovsxwd_avx2(auVar96);
          if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar85 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar85 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar85 >> 0x7f,0) != '\0') ||
                (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar85 >> 0xbf,0) != '\0') ||
              (auVar85 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar85[0x1f] < '\0') {
            auVar85 = vcmpps_avx(auVar90,_DAT_02020f00,4);
            auVar82 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
            auVar96 = vpand_avx(auVar96,auVar82);
            local_2960 = vpmovsxwd_avx2(auVar96);
            if ((((((((local_2960 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_2960 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_2960 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_2960 >> 0x7f,0) != '\0') ||
                  (local_2960 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(local_2960 >> 0xbf,0) != '\0') ||
                (local_2960 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                local_2960[0x1f] < '\0') {
              local_2820 = ZEXT1632(auVar81);
              local_2760 = local_2960;
              local_2680 = local_2520;
              auVar85 = vrcpps_avx(local_27e0);
              auVar132._8_4_ = 0x3f800000;
              auVar132._0_8_ = &DAT_3f8000003f800000;
              auVar132._12_4_ = 0x3f800000;
              auVar132._16_4_ = 0x3f800000;
              auVar132._20_4_ = 0x3f800000;
              auVar132._24_4_ = 0x3f800000;
              auVar132._28_4_ = 0x3f800000;
              auVar82 = vfnmadd213ps_fma(local_27e0,auVar85,auVar132);
              auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar85,auVar85);
              auVar107._8_4_ = 0x219392ef;
              auVar107._0_8_ = 0x219392ef219392ef;
              auVar107._12_4_ = 0x219392ef;
              auVar107._16_4_ = 0x219392ef;
              auVar107._20_4_ = 0x219392ef;
              auVar107._24_4_ = 0x219392ef;
              auVar107._28_4_ = 0x219392ef;
              auVar85 = vcmpps_avx(local_2500,auVar107,5);
              auVar85 = vandps_avx(auVar85,ZEXT1632(auVar82));
              auVar58._4_4_ = auVar81._4_4_ * auVar85._4_4_;
              auVar58._0_4_ = auVar81._0_4_ * auVar85._0_4_;
              auVar58._8_4_ = auVar81._8_4_ * auVar85._8_4_;
              auVar58._12_4_ = auVar81._12_4_ * auVar85._12_4_;
              auVar58._16_4_ = auVar85._16_4_ * 0.0;
              auVar58._20_4_ = auVar85._20_4_ * 0.0;
              auVar58._24_4_ = auVar85._24_4_ * 0.0;
              auVar58._28_4_ = 0;
              auVar98 = vminps_avx(auVar58,auVar132);
              auVar59._4_4_ = auVar92._4_4_ * auVar85._4_4_;
              auVar59._0_4_ = auVar92._0_4_ * auVar85._0_4_;
              auVar59._8_4_ = auVar92._8_4_ * auVar85._8_4_;
              auVar59._12_4_ = auVar92._12_4_ * auVar85._12_4_;
              auVar59._16_4_ = auVar85._16_4_ * 0.0;
              auVar59._20_4_ = auVar85._20_4_ * 0.0;
              auVar59._24_4_ = auVar85._24_4_ * 0.0;
              auVar59._28_4_ = auVar35._28_4_;
              auVar85 = vminps_avx(auVar59,auVar132);
              auVar90 = vsubps_avx(auVar132,auVar98);
              auVar32 = vsubps_avx(auVar132,auVar85);
              local_2720 = vblendvps_avx(auVar85,auVar90,local_2520);
              local_2740 = vblendvps_avx(auVar98,auVar32,local_2520);
              local_26e0[0] = local_27c0._0_4_ * (float)local_2540._0_4_;
              local_26e0[1] = local_27c0._4_4_ * (float)local_2540._4_4_;
              local_26e0[2] = local_27c0._8_4_ * fStack_2538;
              local_26e0[3] = local_27c0._12_4_ * fStack_2534;
              fStack_26d0 = local_27c0._16_4_ * fStack_2530;
              fStack_26cc = local_27c0._20_4_ * fStack_252c;
              fStack_26c8 = local_27c0._24_4_ * fStack_2528;
              uStack_26c4 = local_2740._28_4_;
              local_26c0[0] = (float)local_2540._0_4_ * local_27a0._0_4_;
              local_26c0[1] = (float)local_2540._4_4_ * local_27a0._4_4_;
              local_26c0[2] = fStack_2538 * local_27a0._8_4_;
              local_26c0[3] = fStack_2534 * local_27a0._12_4_;
              fStack_26b0 = fStack_2530 * local_27a0._16_4_;
              fStack_26ac = fStack_252c * local_27a0._20_4_;
              fStack_26a8 = fStack_2528 * local_27a0._24_4_;
              uStack_26a4 = local_2720._28_4_;
              local_26a0[0] = (float)local_2540._0_4_ * fVar108;
              local_26a0[1] = (float)local_2540._4_4_ * fVar121;
              local_26a0[2] = fStack_2538 * fVar113;
              local_26a0[3] = fStack_2534 * fVar114;
              fStack_2690 = fStack_2530 * fVar115;
              fStack_268c = fStack_252c * fVar116;
              fStack_2688 = fStack_2528 * fVar117;
              uStack_2684 = uStack_2524;
              auVar85 = vpmovsxwd_avx2(auVar96);
              auVar95._8_4_ = 0x7f800000;
              auVar95._0_8_ = 0x7f8000007f800000;
              auVar95._12_4_ = 0x7f800000;
              auVar95._16_4_ = 0x7f800000;
              auVar95._20_4_ = 0x7f800000;
              auVar95._24_4_ = 0x7f800000;
              auVar95._28_4_ = 0x7f800000;
              auVar85 = vblendvps_avx(auVar95,local_2700,auVar85);
              auVar98 = vshufps_avx(auVar85,auVar85,0xb1);
              auVar98 = vminps_avx(auVar85,auVar98);
              auVar90 = vshufpd_avx(auVar98,auVar98,5);
              auVar98 = vminps_avx(auVar98,auVar90);
              auVar90 = vpermpd_avx2(auVar98,0x4e);
              auVar98 = vminps_avx(auVar98,auVar90);
              auVar85 = vcmpps_avx(auVar85,auVar98,0);
              auVar81 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
              auVar81 = vpand_avx(auVar81,auVar96);
              auVar85 = vpmovsxwd_avx2(auVar81);
              if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar85 >> 0x7f,0) == '\0') &&
                    (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar85 >> 0xbf,0) == '\0') &&
                  (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar85[0x1f]) {
                auVar85 = local_2960;
              }
              uVar62 = vmovmskps_avx(auVar85);
              uVar63 = 0;
              for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
                uVar63 = uVar63 + 1;
              }
              do {
                uVar68 = (ulong)uVar63;
                uVar63 = *(uint *)((long)&local_23c0 + uVar68 * 4);
                pGVar11 = (pSVar5->geometries).items[uVar63].ptr;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_2960 + uVar68 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar74 = *(undefined4 *)(local_2740 + uVar68 * 4);
                    uVar4 = *(undefined4 *)(local_2720 + uVar68 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_26e0[uVar68 - 8];
                    *(float *)(ray + k * 4 + 0xc0) = local_26e0[uVar68];
                    *(float *)(ray + k * 4 + 0xd0) = local_26c0[uVar68];
                    *(float *)(ray + k * 4 + 0xe0) = local_26a0[uVar68];
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar74;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_28e0 + uVar68 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar63;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  uVar74 = *(undefined4 *)(local_2740 + uVar68 * 4);
                  local_2880._4_4_ = uVar74;
                  local_2880._0_4_ = uVar74;
                  local_2880._8_4_ = uVar74;
                  local_2880._12_4_ = uVar74;
                  uVar74 = *(undefined4 *)(local_2720 + uVar68 * 4);
                  auVar83._4_4_ = uVar74;
                  auVar83._0_4_ = uVar74;
                  auVar83._8_4_ = uVar74;
                  auVar83._12_4_ = uVar74;
                  local_2850._4_4_ = uVar63;
                  local_2850._0_4_ = uVar63;
                  local_2850._8_4_ = uVar63;
                  local_2850._12_4_ = uVar63;
                  uVar74 = *(undefined4 *)((long)&local_28e0 + uVar68 * 4);
                  auVar97._4_4_ = uVar74;
                  auVar97._0_4_ = uVar74;
                  auVar97._8_4_ = uVar74;
                  auVar97._12_4_ = uVar74;
                  fVar1 = local_26e0[uVar68];
                  fVar2 = local_26c0[uVar68];
                  local_28a0._4_4_ = fVar2;
                  local_28a0._0_4_ = fVar2;
                  local_28a0._8_4_ = fVar2;
                  local_28a0._12_4_ = fVar2;
                  fVar2 = local_26a0[uVar68];
                  local_2890._4_4_ = fVar2;
                  local_2890._0_4_ = fVar2;
                  local_2890._8_4_ = fVar2;
                  local_2890._12_4_ = fVar2;
                  local_28b0[0] = (RTCHitN)SUB41(fVar1,0);
                  local_28b0[1] = (RTCHitN)(char)((uint)fVar1 >> 8);
                  local_28b0[2] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                  local_28b0[3] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                  local_28b0[4] = (RTCHitN)SUB41(fVar1,0);
                  local_28b0[5] = (RTCHitN)(char)((uint)fVar1 >> 8);
                  local_28b0[6] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                  local_28b0[7] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                  local_28b0[8] = (RTCHitN)SUB41(fVar1,0);
                  local_28b0[9] = (RTCHitN)(char)((uint)fVar1 >> 8);
                  local_28b0[10] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                  local_28b0[0xb] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                  local_28b0[0xc] = (RTCHitN)SUB41(fVar1,0);
                  local_28b0[0xd] = (RTCHitN)(char)((uint)fVar1 >> 8);
                  local_28b0[0xe] = (RTCHitN)(char)((uint)fVar1 >> 0x10);
                  local_28b0[0xf] = (RTCHitN)(char)((uint)fVar1 >> 0x18);
                  local_2870 = auVar83;
                  local_2860 = auVar97;
                  vpcmpeqd_avx2(ZEXT1632(local_2880),ZEXT1632(local_2880));
                  uStack_283c = context->user->instID[0];
                  local_2840 = uStack_283c;
                  uStack_2838 = uStack_283c;
                  uStack_2834 = uStack_283c;
                  uStack_2830 = context->user->instPrimID[0];
                  uStack_282c = uStack_2830;
                  uStack_2828 = uStack_2830;
                  uStack_2824 = uStack_2830;
                  local_2900._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  *(float *)(ray + k * 4 + 0x80) = local_26e0[uVar68 - 8];
                  local_29d0 = *local_29b8;
                  uStack_29c8 = local_29b8[1];
                  local_2990.valid = (int *)&local_29d0;
                  local_2990.geometryUserPtr = pGVar11->userPtr;
                  local_2990.context = context->user;
                  local_2990.hit = local_28b0;
                  local_2990.N = 4;
                  auVar85 = auVar80._0_32_;
                  local_2990.ray = (RTCRayN *)ray;
                  if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_2920._0_8_ = pauVar72;
                    (*pGVar11->intersectionFilterN)(&local_2990);
                    auVar80._8_56_ = extraout_var;
                    auVar80._0_8_ = extraout_XMM1_Qa;
                    auVar83 = auVar80._0_16_;
                    auVar80 = ZEXT3264(auVar85);
                    pauVar72 = (undefined1 (*) [16])local_2920._0_8_;
                  }
                  auVar37._8_8_ = uStack_29c8;
                  auVar37._0_8_ = local_29d0;
                  if (auVar37 == (undefined1  [16])0x0) {
                    auVar81 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar92 = vpcmpeqd_avx(auVar83,auVar83);
                    auVar81 = auVar81 ^ auVar92;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    auVar92 = vpcmpeqd_avx(auVar97,auVar97);
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_2990);
                      auVar80 = ZEXT3264(auVar85);
                      auVar92 = vpcmpeqd_avx(auVar92,auVar92);
                    }
                    auVar60._8_8_ = uStack_29c8;
                    auVar60._0_8_ = local_29d0;
                    auVar96 = vpcmpeqd_avx(auVar60,_DAT_01feba10);
                    auVar81 = auVar96 ^ auVar92;
                    if (auVar60 != (undefined1  [16])0x0) {
                      auVar96 = auVar96 ^ auVar92;
                      auVar92 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])local_2990.hit);
                      *(undefined1 (*) [16])(local_2990.ray + 0xc0) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_2990.hit + 0x10)
                                              );
                      *(undefined1 (*) [16])(local_2990.ray + 0xd0) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_2990.hit + 0x20)
                                              );
                      *(undefined1 (*) [16])(local_2990.ray + 0xe0) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_2990.hit + 0x30)
                                              );
                      *(undefined1 (*) [16])(local_2990.ray + 0xf0) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_2990.hit + 0x40)
                                              );
                      *(undefined1 (*) [16])(local_2990.ray + 0x100) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_2990.hit + 0x50)
                                              );
                      *(undefined1 (*) [16])(local_2990.ray + 0x110) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_2990.hit + 0x60)
                                              );
                      *(undefined1 (*) [16])(local_2990.ray + 0x120) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_2990.hit + 0x70)
                                              );
                      *(undefined1 (*) [16])(local_2990.ray + 0x130) = auVar92;
                      auVar92 = vmaskmovps_avx(auVar96,*(undefined1 (*) [16])(local_2990.hit + 0x80)
                                              );
                      *(undefined1 (*) [16])(local_2990.ray + 0x140) = auVar92;
                    }
                  }
                  auVar84._8_8_ = 0x100000001;
                  auVar84._0_8_ = 0x100000001;
                  if ((auVar84 & auVar81) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_2900._0_4_;
                  }
                  *(undefined4 *)(local_2960 + uVar68 * 4) = 0;
                  uVar74 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar79._4_4_ = uVar74;
                  auVar79._0_4_ = uVar74;
                  auVar79._8_4_ = uVar74;
                  auVar79._12_4_ = uVar74;
                  auVar79._16_4_ = uVar74;
                  auVar79._20_4_ = uVar74;
                  auVar79._24_4_ = uVar74;
                  auVar79._28_4_ = uVar74;
                  auVar85 = vcmpps_avx(auVar80._0_32_,auVar79,2);
                  local_2960 = vandps_avx(auVar85,local_2960);
                }
                if ((((((((local_2960 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_2960 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_2960 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_2960 >> 0x7f,0) == '\0') &&
                      (local_2960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_2960 >> 0xbf,0) == '\0') &&
                    (local_2960 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_2960[0x1f]) break;
                auVar91._8_4_ = 0x7f800000;
                auVar91._0_8_ = 0x7f8000007f800000;
                auVar91._12_4_ = 0x7f800000;
                auVar91._16_4_ = 0x7f800000;
                auVar91._20_4_ = 0x7f800000;
                auVar91._24_4_ = 0x7f800000;
                auVar91._28_4_ = 0x7f800000;
                auVar85 = vblendvps_avx(auVar91,auVar80._0_32_,local_2960);
                auVar98 = vshufps_avx(auVar85,auVar85,0xb1);
                auVar98 = vminps_avx(auVar85,auVar98);
                auVar90 = vshufpd_avx(auVar98,auVar98,5);
                auVar98 = vminps_avx(auVar98,auVar90);
                auVar90 = vpermpd_avx2(auVar98,0x4e);
                auVar98 = vminps_avx(auVar98,auVar90);
                auVar98 = vcmpps_avx(auVar85,auVar98,0);
                auVar90 = local_2960 & auVar98;
                auVar85 = local_2960;
                if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar90 >> 0x7f,0) != '\0') ||
                      (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar90 >> 0xbf,0) != '\0') ||
                    (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar90[0x1f] < '\0') {
                  auVar85 = vandps_avx(auVar98,local_2960);
                }
                uVar62 = vmovmskps_avx(auVar85);
                uVar63 = 0;
                for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
                  uVar63 = uVar63 + 1;
                }
              } while( true );
            }
          }
        }
        local_2998 = local_2998 + 1;
      } while (local_2998 != uVar75 - 8);
    }
    uVar74 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar80 = ZEXT3264(CONCAT428(uVar74,CONCAT424(uVar74,CONCAT420(uVar74,CONCAT416(uVar74,CONCAT412
                                                  (uVar74,CONCAT48(uVar74,CONCAT44(uVar74,uVar74))))
                                                  ))));
    auVar119 = ZEXT3264(local_2560);
    auVar120 = ZEXT3264(local_2580);
    auVar124 = ZEXT3264(local_25a0);
    auVar133 = ZEXT3264(local_25c0);
    auVar136 = ZEXT3264(local_25e0);
    auVar139 = ZEXT3264(local_2600);
    auVar140 = ZEXT3264(local_2620);
    auVar142 = ZEXT3264(local_2640);
    auVar144 = ZEXT3264(local_2660);
    auVar146 = ZEXT3264(local_2940);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }